

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall Omega_h::VarOp::eval(any *__return_storage_ptr__,VarOp *this,ExprEnv *env)

{
  bool bVar1;
  ostream *poVar2;
  ParserFail *this_00;
  pointer ppVar3;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  _Self local_30;
  _Self local_28;
  iterator it;
  ExprEnv *env_local;
  VarOp *this_local;
  
  it._M_node = (_Base_ptr)env;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
       ::find(&env->variables,&this->name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
       ::end(it._M_node);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>
             ::operator->(&local_28);
    any::any(__return_storage_ptr__,&ppVar3->second);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"unknown variable name \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::operator<<(poVar2,"\"\n");
  this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  ParserFail::ParserFail(this_00,local_1e8);
  __cxa_throw(this_00,&ParserFail::typeinfo,ParserFail::~ParserFail);
}

Assistant:

any VarOp::eval(ExprEnv& env) {
  auto it = env.variables.find(name);
  if (it == env.variables.end()) {
    std::stringstream ss;
    ss << "unknown variable name \"" << name << "\"\n";
    throw ParserFail(ss.str());
  }
  return it->second;
}